

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

TemporaryFileInformation * __thiscall
duckdb::TemporaryFileHandle::GetTemporaryFile
          (TemporaryFileInformation *__return_storage_ptr__,TemporaryFileHandle *this)

{
  TemporaryFileLock lock;
  TemporaryFileLock local_20;
  
  TemporaryFileLock::TemporaryFileLock(&local_20,&this->file_lock);
  (__return_storage_ptr__->path)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->path).field_2
  ;
  (__return_storage_ptr__->path)._M_string_length = 0;
  (__return_storage_ptr__->path).field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->size = (this->identifier).size * (this->index_manager).max_index;
  pthread_mutex_unlock((pthread_mutex_t *)local_20.lock._M_device);
  return __return_storage_ptr__;
}

Assistant:

TemporaryFileInformation TemporaryFileHandle::GetTemporaryFile() {
	TemporaryFileLock lock(file_lock);
	TemporaryFileInformation info;
	info.path = path;
	info.size = GetPositionInFile(index_manager.GetMaxIndex());
	return info;
}